

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.cpp
# Opt level: O0

string * base64_encode_abi_cxx11_(uchar *bytes_to_encode,uint in_len)

{
  char *pcVar1;
  int iVar2;
  undefined1 *puVar3;
  int in_EDX;
  int iVar4;
  undefined1 *in_RSI;
  string *in_RDI;
  uchar char_array_4 [4];
  uchar char_array_3 [3];
  int j;
  int i;
  string *ret;
  undefined1 local_23 [3];
  int local_20;
  int local_1c;
  undefined1 local_15;
  int local_14;
  undefined1 *local_10;
  
  local_15 = 0;
  local_14 = in_EDX;
  local_10 = in_RSI;
  std::__cxx11::string::string((string *)in_RDI);
  local_1c = 0;
  local_20 = 0;
  while (iVar2 = local_14 + -1, local_14 != 0) {
    puVar3 = local_10 + 1;
    iVar4 = local_1c + 1;
    local_23[local_1c] = *local_10;
    local_1c = iVar4;
    local_14 = iVar2;
    local_10 = puVar3;
    if (iVar4 == 3) {
      for (local_1c = 0; local_1c < 4; local_1c = local_1c + 1) {
        pcVar1 = (char *)std::__cxx11::string::operator[](0x45efb0);
        std::__cxx11::string::operator+=((string *)in_RDI,*pcVar1);
      }
      local_1c = 0;
    }
  }
  if (local_1c != 0) {
    for (local_20 = local_1c; local_20 < 3; local_20 = local_20 + 1) {
      local_23[local_20] = 0;
    }
    local_14 = iVar2;
    for (local_20 = 0; local_20 < local_1c + 1; local_20 = local_20 + 1) {
      pcVar1 = (char *)std::__cxx11::string::operator[](0x45efb0);
      std::__cxx11::string::operator+=((string *)in_RDI,*pcVar1);
    }
    while (local_1c < 3) {
      local_1c = local_1c + 1;
      std::__cxx11::string::operator+=((string *)in_RDI,'=');
    }
  }
  return in_RDI;
}

Assistant:

std::string base64_encode(unsigned char const* bytes_to_encode, unsigned int in_len) {
  std::string ret;
  int i = 0;
  int j = 0;
  unsigned char char_array_3[3];
  unsigned char char_array_4[4];

  while (in_len--) {
    char_array_3[i++] = *(bytes_to_encode++);
    if (i == 3) {
      char_array_4[0] = (char_array_3[0] & 0xfc) >> 2;
      char_array_4[1] = ((char_array_3[0] & 0x03) << 4) + ((char_array_3[1] & 0xf0) >> 4);
      char_array_4[2] = ((char_array_3[1] & 0x0f) << 2) + ((char_array_3[2] & 0xc0) >> 6);
      char_array_4[3] = char_array_3[2] & 0x3f;

      for(i = 0; (i <4) ; i++)
        ret += base64_chars[char_array_4[i]];
      i = 0;
    }
  }

  if (i)
  {
    for(j = i; j < 3; j++)
      char_array_3[j] = '\0';

    char_array_4[0] = (char_array_3[0] & 0xfc) >> 2;
    char_array_4[1] = ((char_array_3[0] & 0x03) << 4) + ((char_array_3[1] & 0xf0) >> 4);
    char_array_4[2] = ((char_array_3[1] & 0x0f) << 2) + ((char_array_3[2] & 0xc0) >> 6);
    char_array_4[3] = char_array_3[2] & 0x3f;

    for (j = 0; (j < i + 1); j++)
      ret += base64_chars[char_array_4[j]];

    while((i++ < 3))
      ret += '=';

  }

  return ret;

}